

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_err_Error.cpp
# Opt level: O0

size_t axl::err::pushFormatStringError_va(char *formatString,axl_va_list *va)

{
  ErrorRef *error_00;
  size_t result;
  Error error;
  axl_va_list *in_stack_000000d0;
  char *in_stack_000000d8;
  Error *in_stack_000000e0;
  axl_va_list *in_stack_ffffffffffffff68;
  axl_va_list *in_stack_ffffffffffffff70;
  undefined8 local_88;
  
  Error::Error((Error *)0x17c256);
  axl_va_list::axl_va_list(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  error_00 = (ErrorRef *)
             Error::formatStringError_va(in_stack_000000e0,in_stack_000000d8,in_stack_000000d0);
  axl_va_list::~axl_va_list((axl_va_list *)0x17c299);
  if (error_00 == (ErrorRef *)0xffffffffffffffff) {
    local_88 = 0xffffffffffffffff;
  }
  else {
    local_88 = pushError(error_00);
  }
  Error::~Error((Error *)0x17c2ea);
  return local_88;
}

Assistant:

size_t
pushFormatStringError_va(
	const char* formatString,
	axl_va_list va
) {
	Error error;
	size_t result = error.formatStringError_va(formatString, va);
	return result != -1 ? pushError(error) : -1;
}